

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Company *company)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  Boss *boss;
  long *plVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  long *plVar8;
  uint uVar9;
  int iVar10;
  string *psVar11;
  ostream *poVar12;
  long lVar13;
  long lVar14;
  ulong __n;
  Employee *pEVar15;
  char *pcVar16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  Employee *pEVar19;
  Employee *pEVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  uint uVar22;
  ulong uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  Employee EStack_248;
  Employee *apEStack_e0 [4];
  Company *local_c0;
  Employee *local_b8;
  long *local_b0;
  ulong local_a8;
  long local_a0 [2];
  long *local_90;
  ulong local_88;
  long local_80 [2];
  undefined8 uStack_70;
  long local_68;
  ulong local_60;
  Employee *local_58;
  Employee *local_50 [2];
  Employee *local_40;
  ostream *local_38;
  
  apEStack_e0[0] = (Employee *)0x105377;
  local_c0 = company;
  local_38 = os;
  uVar9 = Boss::getNumberOfEmployees(company->boss);
  uVar17 = (ulong)uVar9;
  lVar13 = uVar17 * 0xb8;
  lVar6 = -(lVar13 + 0xfU & 0xfffffffffffffff0);
  pEVar20 = (Employee *)((long)apEStack_e0 + lVar6 + 8);
  local_68 = lVar13;
  local_60 = uVar17;
  if (uVar9 != 0) {
    lVar14 = 0;
    do {
      pcVar16 = (pEVar20->super_Person).name.field_2._M_local_buf + lVar14;
      *(char **)((long)&(pEVar20->super_Person).name._M_dataplus._M_p + lVar14) = pcVar16;
      *(undefined8 *)((long)&(pEVar20->super_Person).name._M_string_length + lVar14) = 0;
      *pcVar16 = '\0';
      puVar1 = (undefined1 *)((long)local_a0 + lVar14 + lVar6);
      *(undefined1 **)(puVar1 + -0x10) = puVar1;
      *(undefined8 *)(puVar1 + -8) = 0;
      *puVar1 = 0;
      puVar1 = (undefined1 *)((long)local_80 + lVar14 + lVar6);
      *(undefined1 **)(puVar1 + -0x10) = puVar1;
      *(undefined8 *)(puVar1 + -8) = 0;
      *puVar1 = 0;
      puVar1 = (undefined1 *)((long)&local_60 + lVar14 + lVar6);
      *(undefined1 **)(puVar1 + -0x10) = puVar1;
      *(undefined8 *)(puVar1 + -8) = 0;
      *puVar1 = 0;
      puVar2 = (undefined1 *)((long)&local_40 + lVar14 + lVar6);
      *(undefined1 **)(puVar2 + -0x10) = puVar2;
      *(undefined8 *)(puVar2 + -8) = 0;
      *puVar2 = 0;
      *(undefined ***)(puVar1 + -0x78) = &PTR_validate_00109d68;
      lVar14 = lVar14 + 0xb8;
    } while (lVar13 != lVar14);
    uStack_70._4_4_ = (uint)(0 < (int)uVar9);
    if (0 < (int)uVar9) {
      uVar23 = 0;
      pEVar15 = pEVar20;
      do {
        pEVar19 = local_c0->employees[uVar23];
        *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105442;
        Employee::operator=(pEVar15,pEVar19);
        uVar23 = uVar23 + 1;
        pEVar15 = pEVar15 + 1;
      } while (uVar17 != uVar23);
      uVar22 = uStack_70._4_4_;
      if (uVar17 != 1) {
        apEStack_e0[2] = (Employee *)(uVar17 - 1);
        local_b8 = (Employee *)(ulong)(uVar9 - 1);
        apEStack_e0[3] = (Employee *)((long)&pEVar20[-2].super_Person._vptr_Person + local_68);
        local_50[1] = (Employee *)0x0;
        pEVar15 = apEStack_e0[2];
        pEVar19 = apEStack_e0[3];
        local_58 = pEVar20;
        do {
          pEVar20 = pEVar19 + 1;
          *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1054b2;
          psVar11 = Person::getId_abi_cxx11_(&pEVar20->super_Person);
          *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1054c8;
          std::__cxx11::string::substr((ulong)&local_90,(ulong)psVar11);
          *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1054d0;
          psVar11 = Person::getId_abi_cxx11_(&pEVar19->super_Person);
          *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1054e6;
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar11);
          uVar23 = local_88;
          plVar8 = local_90;
          uVar17 = local_a8;
          plVar4 = local_b0;
          __n = local_88;
          if (local_a8 < local_88) {
            __n = local_a8;
          }
          local_50[0] = pEVar20;
          local_40 = pEVar15;
          if (__n == 0) {
LAB_00105525:
            lVar13 = uVar23 - uVar17;
            if (lVar13 < -0x7fffffff) {
              lVar13 = -0x80000000;
            }
            if (0x7ffffffe < lVar13) {
              lVar13 = 0x7fffffff;
            }
            iVar10 = (int)lVar13;
          }
          else {
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10551e;
            iVar10 = memcmp(plVar8,plVar4,__n);
            if (iVar10 == 0) goto LAB_00105525;
          }
          if (plVar4 != local_a0) {
            uVar17 = local_a0[0] + 1;
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105567;
            operator_delete(plVar4,uVar17);
          }
          uVar17 = local_60;
          plVar4 = local_90;
          if (local_90 != local_80) {
            uVar23 = local_80[0] + 1;
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105587;
            operator_delete(plVar4,uVar23);
          }
          pEVar15 = local_40;
          pEVar20 = local_50[0];
          if (iVar10 < 0) {
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10559c;
            std::swap<Employee>(pEVar20,pEVar19);
          }
          pEVar15 = (Employee *)((long)&pEVar15[-1].workDone + 3);
          pEVar19 = pEVar19 + -1;
        } while (((long)local_50[1] < (long)pEVar15) ||
                (local_50[1] = (Employee *)((long)&(local_50[1]->super_Person)._vptr_Person + 1),
                pEVar15 = apEStack_e0[2], pEVar19 = apEStack_e0[3], local_50[1] != local_b8));
        pEVar20 = local_58;
        uVar22 = uStack_70._4_4_;
        if ((int)uVar17 != 1) {
          local_50[0] = (Employee *)(uVar17 - 1);
          local_50[1] = (Employee *)((long)&local_58[-2].super_Person._vptr_Person + local_68);
          local_40 = (Employee *)0x0;
          pEVar15 = local_50[1];
          pEVar19 = local_50[0];
          do {
            pEVar20 = pEVar15 + 1;
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10560f;
            psVar11 = Person::getId_abi_cxx11_(&pEVar20->super_Person);
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105625;
            std::__cxx11::string::substr((ulong)&local_90,(ulong)psVar11);
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10562d;
            psVar11 = Person::getId_abi_cxx11_(&pEVar15->super_Person);
            *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105643;
            std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar11);
            uVar17 = local_88;
            plVar8 = local_90;
            plVar4 = local_b0;
            if (local_88 == local_a8) {
              if (local_88 != 0) {
                *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10566f;
                iVar10 = bcmp(plVar8,plVar4,uVar17);
                if (iVar10 != 0) goto LAB_001056eb;
              }
              *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10567b;
              psVar11 = Person::getName_abi_cxx11_(&pEVar20->super_Person);
              *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105686;
              Person::getName_abi_cxx11_(&pEVar15->super_Person);
              *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105691;
              iVar10 = std::__cxx11::string::compare((string *)psVar11);
              plVar4 = local_b0;
              if (local_b0 != local_a0) {
                uVar17 = local_a0[0] + 1;
                *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1056b6;
                operator_delete(plVar4,uVar17);
              }
              plVar4 = local_90;
              if (local_90 != local_80) {
                uVar17 = local_80[0] + 1;
                *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1056d2;
                operator_delete(plVar4,uVar17);
              }
              if (iVar10 < 0) {
                *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1056e2;
                std::swap<Employee>(pEVar20,pEVar15);
              }
            }
            else {
LAB_001056eb:
              if (plVar4 != local_a0) {
                uVar17 = local_a0[0] + 1;
                *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105709;
                operator_delete(plVar4,uVar17);
              }
              plVar4 = local_90;
              if (local_90 != local_80) {
                uVar17 = local_80[0] + 1;
                *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105725;
                operator_delete(plVar4,uVar17);
              }
            }
            pEVar19 = (Employee *)((long)&pEVar19[-1].workDone + 3);
            pEVar15 = pEVar15 + -1;
          } while (((long)local_40 < (long)pEVar19) ||
                  (local_40 = (Employee *)((long)&(local_40->super_Person)._vptr_Person + 1),
                  pEVar15 = local_50[1], pEVar20 = local_58, pEVar19 = local_50[0],
                  uVar22 = uStack_70._4_4_, local_40 != local_b8));
        }
      }
      goto LAB_0010575e;
    }
  }
  uVar22 = 0;
LAB_0010575e:
  poVar12 = local_38;
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105773;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Boss : ",7);
  uVar3 = *(undefined8 *)(*(long *)local_38 + -0x18);
  cVar7 = (char)local_38;
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10578b;
  std::ios::widen((char)uVar3 + cVar7);
  poVar12 = local_38;
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105797;
  std::ostream::put((char)poVar12);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10579f;
  poVar12 = (ostream *)std::ostream::flush();
  boss = local_c0->boss;
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1057b2;
  poVar12 = operator<<(poVar12,boss);
  uVar3 = *(undefined8 *)(*(long *)poVar12 + -0x18);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1057c9;
  std::ios::widen((char)uVar3 + (char)poVar12);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1057d4;
  std::ostream::put((char)poVar12);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1057dc;
  poVar12 = (ostream *)std::ostream::flush();
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1057f3;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"-------------------------------------\n",0x26);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105807;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Employees :",0xb);
  uVar3 = *(undefined8 *)(*(long *)poVar12 + -0x18);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10581b;
  std::ios::widen((char)uVar3 + (char)poVar12);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105826;
  std::ostream::put((char)poVar12);
  *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10582e;
  std::ostream::flush();
  uVar17 = local_60;
  pEVar15 = pEVar20;
  if ((char)uVar22 != '\0') {
    do {
      poVar12 = local_38;
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105851;
      poVar12 = operator<<(poVar12,pEVar15);
      uVar3 = *(undefined8 *)(*(long *)poVar12 + -0x18);
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105868;
      std::ios::widen((char)uVar3 + (char)poVar12);
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105873;
      std::ostream::put((char)poVar12);
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10587b;
      poVar12 = (ostream *)std::ostream::flush();
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x10588e;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"----------------------------------------------------------------------",
                 0x46);
      uVar3 = *(undefined8 *)(*(long *)poVar12 + -0x18);
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1058a2;
      std::ios::widen((char)uVar3 + (char)poVar12);
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1058ad;
      std::ostream::put((char)poVar12);
      *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1058b5;
      std::ostream::flush();
      uVar17 = uVar17 - 1;
      pEVar15 = pEVar15 + 1;
    } while (uVar17 != 0);
  }
  if (local_60 != 0) {
    local_40 = (Employee *)&pEVar20[-1].super_Person.name.field_2;
    paVar24 = &pEVar20[-1].super_Person.address.street.field_2;
    local_50[0] = (Employee *)&pEVar20[-1].super_Person.id.field_2;
    paVar21 = &pEVar20[-1].super_Person.address.country.field_2;
    paVar18 = &pEVar20[-1].super_Person.address.city.field_2;
    lVar14 = 0;
    local_50[1] = (Employee *)&PTR_validate_00109d98;
    lVar13 = local_68;
    do {
      *(Employee **)((long)paVar24 + lVar13 + -0x98) = local_50[1];
      plVar4 = *(long **)((long)paVar24 + lVar13 + -0x10);
      if ((long *)(paVar24->_M_local_buf + lVar13) != plVar4) {
        lVar13 = *(long *)(paVar24->_M_local_buf + lVar13);
        *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105928;
        operator_delete(plVar4,lVar13 + 1);
      }
      lVar13 = local_68;
      pcVar16 = *(char **)((long)paVar24 + local_68 + -0x30);
      if (paVar18->_M_local_buf + local_68 != pcVar16) {
        lVar5 = *(long *)((long)paVar24 + local_68 + -0x20);
        *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105947;
        operator_delete(pcVar16,lVar5 + 1);
      }
      pcVar16 = *(char **)((long)paVar24 + lVar13 + -0x50);
      if (paVar21->_M_local_buf + lVar13 != pcVar16) {
        lVar5 = *(long *)((long)paVar24 + lVar13 + -0x40);
        *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105962;
        operator_delete(pcVar16,lVar5 + 1);
      }
      pcVar16 = *(char **)((long)paVar24 + lVar13 + -0x70);
      if ((char *)((long)local_50[0] + lVar13) != pcVar16) {
        lVar5 = *(long *)((long)paVar24 + lVar13 + -0x60);
        *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x105980;
        operator_delete(pcVar16,lVar5 + 1);
      }
      pcVar16 = *(char **)((long)paVar24 + lVar13 + -0x90);
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&local_40->super_Person)->_M_local_buf + lVar13 != pcVar16) {
        lVar5 = *(long *)((long)paVar24 + lVar13 + -0x80);
        *(undefined8 *)((long)apEStack_e0 + lVar6) = 0x1059a1;
        operator_delete(pcVar16,lVar5 + 1);
      }
      local_40 = local_40 + -1;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar24 + -0xb8);
      local_50[0] = (Employee *)((long)local_50[0] + -0xb8);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar21 + -0xb8);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar18 + -0xb8);
      lVar14 = lVar14 + 0xb8;
    } while (lVar13 != lVar14);
  }
  return local_38;
}

Assistant:

ostream &operator<<(ostream &os, const Company &company) {
    // copy the value of employees to another array to avoid changes in the original array
    int n = company.boss->getNumberOfEmployees();
    Employee newEmployees[n];
    for (int i = 0; i < n; ++i) {
        newEmployees[i] = *company.employees[i];
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the id's first two chars
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) < newEmployees[j - 1].getId().substr(0, 2))
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the name
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) == newEmployees[j - 1].getId().substr(0, 2) &&
                newEmployees[j].getName() < newEmployees[j - 1].getName())
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    os << "Boss : " << endl << *company.boss << endl << "-------------------------------------\n" << "Employees :"
       << endl;
    for (int i = 0; i < n; ++i) {
        os << newEmployees[i] << endl << "----------------------------------------------------------------------"
           << endl;
    }
    return os;
}